

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

bool __thiscall toml::internal::Parser::parseValue(Parser *this,Value *v)

{
  pointer pcVar1;
  bool bVar2;
  allocator local_41;
  undefined1 local_40 [8];
  anon_union_8_8_51f126cb_for_Value_2 local_38;
  
  switch((this->token_).type_) {
  case ERROR_TOKEN:
    addError(this,&(this->token_).str_value_);
    return false;
  default:
    std::__cxx11::string::string((string *)local_40,"unexpected token",&local_41);
    addError(this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    return false;
  case STRING:
  case MULTILINE_STRING:
    Value::Value((Value *)local_40,&(this->token_).str_value_);
    break;
  case BOOL:
    local_40._0_4_ = BOOL_TYPE;
    local_38.bool_ = (this->token_).int_value_ != 0;
    break;
  case INT:
    local_38 = (anon_union_8_8_51f126cb_for_Value_2)(this->token_).int_value_;
    local_40._0_4_ = INT_TYPE;
    break;
  case DOUBLE:
    local_38 = (anon_union_8_8_51f126cb_for_Value_2)(this->token_).double_value_;
    local_40._0_4_ = DOUBLE_TYPE;
    break;
  case TIME:
    pcVar1 = (pointer)(this->token_).time_value_.__d.__r;
    local_40._0_4_ = TIME_TYPE;
    local_38.null_ = operator_new(8);
    ((local_38.string_)->_M_dataplus)._M_p = pcVar1;
    break;
  case LBRACKET:
    bVar2 = parseArray(this,v);
    return bVar2;
  case LBRACE:
    bVar2 = parseInlineTable(this,v);
    return bVar2;
  }
  Value::operator=(v,(Value *)local_40);
  Value::~Value((Value *)local_40);
  nextValue(this);
  return true;
}

Assistant:

inline bool Parser::parseValue(Value* v)
{
    switch (token().type()) {
    case TokenType::STRING:
    case TokenType::MULTILINE_STRING:
        *v = token().strValue();
        nextValue();
        return true;
    case TokenType::LBRACKET:
        return parseArray(v);
    case TokenType::LBRACE:
        return parseInlineTable(v);
    case TokenType::BOOL:
        *v = token().boolValue();
        nextValue();
        return true;
    case TokenType::INT:
        *v = token().intValue();
        nextValue();
        return true;
    case TokenType::DOUBLE:
        *v = token().doubleValue();
        nextValue();
        return true;
    case TokenType::TIME:
        *v = token().timeValue();
        nextValue();
        return true;
    case TokenType::ERROR_TOKEN:
        addError(token().strValue());
        return false;
    default:
        addError("unexpected token");
        return false;
    }
}